

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int mixed_buffer_copy(mixed_buffer *from,mixed_buffer *to)

{
  uint32_t size;
  uint32_t samples;
  float *write;
  float *read;
  
  mixed_err(0);
  if (from != to) {
    samples = 0xffffffff;
    mixed_buffer_request_read(&read,&samples,from);
    mixed_buffer_request_write(&write,&samples,to);
    size = samples;
    memcpy(write,read,(ulong)samples << 2);
    mixed_buffer_finish_write(size,to);
  }
  return 1;
}

Assistant:

MIXED_EXPORT int mixed_buffer_copy(struct mixed_buffer *from, struct mixed_buffer *to){
  mixed_err(MIXED_NO_ERROR);
  if(from != to){
    float *restrict read, *restrict write;
    uint32_t samples = UINT32_MAX;
    mixed_buffer_request_read(&read, &samples, from);
    mixed_buffer_request_write(&write, &samples, to);
    memcpy(write, read, sizeof(float)*samples);
    mixed_buffer_finish_write(samples, to);
  }
  return 1;
}